

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::gm_comp_unit(SyntaxAnalyze *this)

{
  size_t sVar1;
  pointer pWVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  
  hp_init_external_function(this);
  irGenerator::irGenerator::ir_begin_of_program(&this->irGenerator);
  sVar1 = this->matched_index;
  lVar5 = (long)(this->word_list->
                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->word_list->
                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                super__Vector_impl_data._M_start;
  do {
    if ((ulong)((lVar5 >> 4) * -0x5555555555555555) <= sVar1 + 1) {
      irGenerator::irGenerator::ir_end_of_program(&this->irGenerator);
      return;
    }
    bVar3 = try_word(this,1,INTTK,VOIDTK);
    if (bVar3) {
      uVar4 = this->matched_index + 2;
      pWVar2 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->word_list->
                         super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                 -0x5555555555555555) <= uVar4) goto LAB_001a05a9;
      bVar3 = word::Word::match_token(pWVar2 + uVar4,IDENFR);
      if (!bVar3) goto LAB_001a05a9;
      uVar4 = this->matched_index + 3;
      pWVar2 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->word_list->
                         super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                 -0x5555555555555555) <= uVar4) goto LAB_001a05a9;
      bVar3 = word::Word::match_token(pWVar2 + uVar4,LPARENT);
      if (!bVar3) goto LAB_001a05a9;
      gm_func_def(this);
    }
    else {
LAB_001a05a9:
      uVar4 = this->matched_index + 1;
      pWVar2 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar4 < (ulong)(((long)(this->word_list->
                                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                         -0x5555555555555555)) {
        bVar3 = word::Word::match_token(pWVar2 + uVar4,CONSTTK);
        if (bVar3) {
          gm_const_decl(this);
          goto LAB_001a05f6;
        }
      }
      gm_var_decl(this);
    }
LAB_001a05f6:
    sVar1 = this->matched_index;
    lVar5 = (long)(this->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

void SyntaxAnalyze::gm_comp_unit() {
  hp_init_external_function();

  irGenerator.ir_begin_of_program();

  while (matched_index + 1 < word_list.size()) {
    if (try_word(1, Token::INTTK, Token::VOIDTK) &&
        try_word(2, Token::IDENFR) && try_word(3, Token::LPARENT)) {
      gm_func_def();
    } else if (try_word(1, Token::CONSTTK)) {
      gm_const_decl();
    } else {
      gm_var_decl();
    }
  }

  irGenerator.ir_end_of_program();
}